

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  pointer *ppuVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer pIVar4;
  pointer paVar5;
  iterator __position;
  IntBone_MDL7 *pIVar6;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  iterator __position_00;
  pointer pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  uint uVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  uint *puVar28;
  long lVar29;
  Logger *this_01;
  aiBone **ppaVar30;
  aiBone *paVar31;
  aiVertexWeight *__s;
  aiFace *paVar32;
  ulong uVar33;
  const_iterator k;
  pointer pvVar34;
  aiVector3D **ppaVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  aiMesh *pcMesh;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  aiMesh *local_498;
  aiVector3D **local_490;
  ulong local_488;
  IntSplitGroupData_MDL7 *local_480;
  IntSharedData_MDL7 *local_478;
  uint local_46c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_468;
  ulong local_448;
  char *local_440;
  uint local_434;
  undefined1 local_430 [1024];
  
  local_478 = splitGroupData->shared;
  if ((local_478->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_478->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_448 = (ulong)*(uint *)(this->mBuffer + 8);
    local_46c = *(uint *)(this->mBuffer + 8) - 1;
    ppaVar35 = (aiVector3D **)0x0;
    local_480 = splitGroupData;
    do {
      ppvVar2 = local_480->aiSplit;
      pvVar3 = ppvVar2[(long)ppaVar35];
      if ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar24 = (aiMesh *)operator_new(0x520);
        paVar24->mPrimitiveTypes = 0;
        paVar24->mNumVertices = 0;
        paVar24->mNumFaces = 0;
        local_490 = &paVar24->mVertices;
        memset(local_490,0,0xcc);
        paVar24->mBones = (aiBone **)0x0;
        paVar24->mMaterialIndex = 0;
        (paVar24->mName).length = 0;
        (paVar24->mName).data[0] = '\0';
        memset((paVar24->mName).data + 1,0x1b,0x3ff);
        paVar24->mNumAnimMeshes = 0;
        paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar24->mMethod = 0;
        (paVar24->mAABB).mMin.x = 0.0;
        (paVar24->mAABB).mMin.y = 0.0;
        (paVar24->mAABB).mMin.z = 0.0;
        (paVar24->mAABB).mMax.x = 0.0;
        (paVar24->mAABB).mMax.y = 0.0;
        (paVar24->mAABB).mMax.z = 0.0;
        paVar24->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar24->mNumUVComponents[0] = 0;
        paVar24->mNumUVComponents[1] = 0;
        paVar24->mNumUVComponents[2] = 0;
        paVar24->mNumUVComponents[3] = 0;
        paVar24->mNumUVComponents[4] = 0;
        paVar24->mNumUVComponents[5] = 0;
        paVar24->mNumUVComponents[6] = 0;
        paVar24->mNumUVComponents[7] = 0;
        paVar24->mColors[0] = (aiColor4D *)0x0;
        paVar24->mColors[1] = (aiColor4D *)0x0;
        paVar24->mColors[2] = (aiColor4D *)0x0;
        paVar24->mColors[3] = (aiColor4D *)0x0;
        paVar24->mColors[4] = (aiColor4D *)0x0;
        paVar24->mColors[5] = (aiColor4D *)0x0;
        paVar24->mColors[6] = (aiColor4D *)0x0;
        paVar24->mColors[7] = (aiColor4D *)0x0;
        paVar24->mPrimitiveTypes = 4;
        paVar24->mMaterialIndex = (uint)ppaVar35;
        pvVar3 = ppvVar2[(long)ppaVar35];
        uVar39 = (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar37 = (uint)uVar39;
        paVar24->mNumFaces = uVar37;
        uVar39 = uVar39 & 0xffffffff;
        local_498 = paVar24;
        puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
        *puVar25 = uVar39;
        paVar26 = (aiFace *)(puVar25 + 1);
        if (uVar39 != 0) {
          paVar32 = paVar26;
          do {
            paVar32->mNumIndices = 0;
            paVar32->mIndices = (uint *)0x0;
            paVar32 = paVar32 + 1;
          } while (paVar32 != paVar26 + uVar39);
        }
        paVar24->mFaces = paVar26;
        uVar39 = (ulong)(uVar37 * 3);
        paVar24->mNumVertices = uVar37 * 3;
        local_488 = uVar39 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(local_488);
        if (uVar37 != 0) {
          memset(paVar27,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *local_490 = paVar27;
        paVar27 = (aiVector3D *)operator_new__(local_488);
        if (uVar37 != 0) {
          memset(paVar27,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar24->mNormals = paVar27;
        local_490 = ppaVar35;
        if ((groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar24->mNumUVComponents[0] = 2;
          uVar37 = paVar24->mNumVertices;
          uVar39 = (ulong)uVar37;
          paVar27 = (aiVector3D *)operator_new__(uVar39 * 0xc);
          if (uVar37 != 0) {
            memset(paVar27,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          ppaVar35 = local_490;
          paVar24->mTextureCoords[0] = paVar27;
          if ((groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            paVar24->mNumUVComponents[1] = 2;
            paVar27 = (aiVector3D *)operator_new__(uVar39 * 0xc);
            if (uVar39 != 0) {
              memset(paVar27,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar24->mTextureCoords[1] = paVar27;
          }
        }
        if (local_498->mNumFaces != 0) {
          uVar39 = 0;
          uVar33 = 0;
          do {
            local_498->mFaces[uVar39].mNumIndices = 3;
            puVar28 = (uint *)operator_new__(0xc);
            local_498->mFaces[uVar39].mIndices = puVar28;
            uVar37 = (local_480->aiSplit[(long)ppaVar35]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar39];
            pIVar4 = (groupData->pcFaces).
                     super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar29 = 0;
            do {
              uVar23 = pIVar4[uVar37].mIndices[lVar29];
              paVar5 = (groupData->vPositions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mVertices;
              uVar36 = uVar33 + lVar29 & 0xffffffff;
              paVar27[uVar36].z = paVar5[uVar23].z;
              paVar5 = paVar5 + uVar23;
              fVar8 = paVar5->y;
              paVar27 = paVar27 + uVar36;
              paVar27->x = paVar5->x;
              paVar27->y = fVar8;
              paVar5 = (groupData->vNormals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mNormals;
              paVar27[uVar36].z = paVar5[uVar23].z;
              paVar5 = paVar5 + uVar23;
              fVar8 = paVar5->y;
              paVar27 = paVar27 + uVar36;
              paVar27->x = paVar5->x;
              paVar27->y = fVar8;
              paVar5 = (groupData->vTextureCoords1).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (paVar5 != (groupData->vTextureCoords1).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                paVar27 = local_498->mTextureCoords[0];
                paVar27[uVar36].z = paVar5[uVar23].z;
                fVar8 = paVar5[uVar23].y;
                paVar27 = paVar27 + uVar36;
                paVar27->x = paVar5[uVar23].x;
                paVar27->y = fVar8;
                paVar5 = (groupData->vTextureCoords2).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if (paVar5 != (groupData->vTextureCoords2).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  paVar27 = local_498->mTextureCoords[1];
                  paVar27[uVar36].z = paVar5[uVar23].z;
                  fVar8 = paVar5[uVar23].y;
                  paVar27 = paVar27 + uVar36;
                  paVar27->x = paVar5[uVar23].x;
                  paVar27->y = fVar8;
                }
              }
              local_498->mFaces[uVar39].mIndices[lVar29] = (uint)(uVar33 + lVar29);
              lVar29 = lVar29 + 1;
            } while (lVar29 != 3);
            uVar39 = uVar39 + 1;
            uVar33 = (ulong)((int)uVar33 + 3);
            ppaVar35 = local_490;
          } while (uVar39 < local_498->mNumFaces);
        }
        uVar39 = local_448;
        if ((groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize(&local_468,local_448);
          pvVar7 = local_468.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_498->mNumFaces != 0) {
            uVar33 = 0;
            iVar38 = 0;
            do {
              uVar37 = (local_480->aiSplit[(long)local_490]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar33];
              pIVar4 = (groupData->pcFaces).
                       super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar29 = 0;
              do {
                uVar23 = (groupData->aiBones).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[pIVar4[uVar37].mIndices[lVar29]];
                if (uVar23 != 0xffffffff) {
                  if ((uint)uVar39 <= uVar23) {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                                 );
                    uVar23 = local_46c;
                  }
                  local_434 = iVar38 + (int)lVar29;
                  pvVar3 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar23;
                  __position._M_current =
                       (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>(pvVar3,__position,&local_434);
                  }
                  else {
                    *__position._M_current = local_434;
                    ppuVar1 = &(pvVar3->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar1 = *ppuVar1 + 1;
                  }
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              uVar33 = uVar33 + 1;
              iVar38 = iVar38 + 3;
              pvVar7 = local_468.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < local_498->mNumFaces);
          }
          for (; pvVar34 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start, paVar24 = local_498,
              pvVar7 != local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
            if ((pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              local_498->mNumBones = local_498->mNumBones + 1;
            }
          }
          ppaVar30 = (aiBone **)operator_new__((ulong)local_498->mNumBones << 3);
          paVar24->mBones = ppaVar30;
          if (pvVar34 !=
              local_468.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_488 = 0;
            do {
              if ((pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
                paVar31 = (aiBone *)operator_new(0x450);
                (paVar31->mName).length = 0;
                local_440 = (paVar31->mName).data;
                (paVar31->mName).data[0] = '\0';
                memset((paVar31->mName).data + 1,0x1b,0x3ff);
                uVar39 = local_488;
                paVar31->mNumWeights = 0;
                paVar31->mWeights = (aiVertexWeight *)0x0;
                (paVar31->mOffsetMatrix).a1 = 1.0;
                (paVar31->mOffsetMatrix).a2 = 0.0;
                (paVar31->mOffsetMatrix).a3 = 0.0;
                (paVar31->mOffsetMatrix).a4 = 0.0;
                (paVar31->mOffsetMatrix).b1 = 0.0;
                (paVar31->mOffsetMatrix).b2 = 1.0;
                (paVar31->mOffsetMatrix).b3 = 0.0;
                (paVar31->mOffsetMatrix).b4 = 0.0;
                (paVar31->mOffsetMatrix).c1 = 0.0;
                (paVar31->mOffsetMatrix).c2 = 0.0;
                (paVar31->mOffsetMatrix).c3 = 1.0;
                (paVar31->mOffsetMatrix).c4 = 0.0;
                (paVar31->mOffsetMatrix).d1 = 0.0;
                (paVar31->mOffsetMatrix).d2 = 0.0;
                (paVar31->mOffsetMatrix).d3 = 0.0;
                (paVar31->mOffsetMatrix).d4 = 1.0;
                local_498->mBones[local_488] = paVar31;
                uVar37 = (local_478->apcOutBones[local_488]->super_aiBone).mName.length;
                if (0x3fe < uVar37) {
                  uVar37 = 0x3ff;
                }
                uVar33 = (ulong)uVar37;
                local_434 = uVar37;
                memcpy(local_430,(local_478->apcOutBones[local_488]->super_aiBone).mName.data,uVar33
                      );
                local_430[uVar33] = 0;
                (paVar31->mName).length = uVar37;
                memcpy(local_440,local_430,uVar33);
                (paVar31->mName).data[uVar33] = '\0';
                pIVar6 = local_478->apcOutBones[uVar39];
                fVar19 = (pIVar6->super_aiBone).mOffsetMatrix.a1;
                fVar20 = (pIVar6->super_aiBone).mOffsetMatrix.a2;
                fVar21 = (pIVar6->super_aiBone).mOffsetMatrix.a3;
                fVar22 = (pIVar6->super_aiBone).mOffsetMatrix.a4;
                fVar15 = (pIVar6->super_aiBone).mOffsetMatrix.b1;
                fVar16 = (pIVar6->super_aiBone).mOffsetMatrix.b2;
                fVar17 = (pIVar6->super_aiBone).mOffsetMatrix.b3;
                fVar18 = (pIVar6->super_aiBone).mOffsetMatrix.b4;
                fVar11 = (pIVar6->super_aiBone).mOffsetMatrix.c1;
                fVar12 = (pIVar6->super_aiBone).mOffsetMatrix.c2;
                fVar13 = (pIVar6->super_aiBone).mOffsetMatrix.c3;
                fVar14 = (pIVar6->super_aiBone).mOffsetMatrix.c4;
                fVar8 = (pIVar6->super_aiBone).mOffsetMatrix.d2;
                fVar9 = (pIVar6->super_aiBone).mOffsetMatrix.d3;
                fVar10 = (pIVar6->super_aiBone).mOffsetMatrix.d4;
                (paVar31->mOffsetMatrix).d1 = (pIVar6->super_aiBone).mOffsetMatrix.d1;
                (paVar31->mOffsetMatrix).d2 = fVar8;
                (paVar31->mOffsetMatrix).d3 = fVar9;
                (paVar31->mOffsetMatrix).d4 = fVar10;
                (paVar31->mOffsetMatrix).c1 = fVar11;
                (paVar31->mOffsetMatrix).c2 = fVar12;
                (paVar31->mOffsetMatrix).c3 = fVar13;
                (paVar31->mOffsetMatrix).c4 = fVar14;
                (paVar31->mOffsetMatrix).b1 = fVar15;
                (paVar31->mOffsetMatrix).b2 = fVar16;
                (paVar31->mOffsetMatrix).b3 = fVar17;
                (paVar31->mOffsetMatrix).b4 = fVar18;
                (paVar31->mOffsetMatrix).a1 = fVar19;
                (paVar31->mOffsetMatrix).a2 = fVar20;
                (paVar31->mOffsetMatrix).a3 = fVar21;
                (paVar31->mOffsetMatrix).a4 = fVar22;
                uVar33 = (long)(pvVar34->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar34->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                paVar31->mNumWeights = (uint)uVar33;
                uVar33 = uVar33 & 0xffffffff;
                uVar39 = uVar33 * 8;
                __s = (aiVertexWeight *)operator_new__(uVar39);
                if (uVar33 != 0) {
                  memset(__s,0,uVar39);
                }
                paVar31->mWeights = __s;
                if (paVar31->mNumWeights != 0) {
                  uVar39 = 0;
                  do {
                    paVar31->mWeights[uVar39].mVertexId =
                         (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar39];
                    paVar31->mWeights[uVar39].mWeight = 1.0;
                    uVar39 = uVar39 + 1;
                  } while (uVar39 < paVar31->mNumWeights);
                }
              }
              pvVar34 = pvVar34 + 1;
              local_488 = local_488 + 1;
            } while (pvVar34 !=
                     local_468.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_468);
          ppaVar35 = local_490;
        }
        this_00 = (vector<aiMesh*,std::allocator<aiMesh*>> *)local_480->avOutList;
        __position_00._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position_00._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position_00,&local_498);
        }
        else {
          *__position_00._M_current = local_498;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      ppaVar35 = (aiVector3D **)((long)ppaVar35 + 1);
    } while (ppaVar35 <
             (ulong)((long)(local_478->pcMats).
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_478->pcMats).
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}